

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteF64
          (BinaryWriterSpec *this,uint64_t f64_bits,ExpectedNan expected)

{
  char *format;
  Stream *this_00;
  
  if (expected == Arithmetic) {
    this_00 = this->json_stream_;
    format = "\"%s\"";
    f64_bits = (uint64_t)"nan:arithmetic";
  }
  else if (expected == Canonical) {
    this_00 = this->json_stream_;
    format = "\"%s\"";
    f64_bits = (uint64_t)"nan:canonical";
  }
  else {
    if (expected != None) {
      return;
    }
    this_00 = this->json_stream_;
    format = "\"%lu\"";
  }
  Stream::Writef(this_00,format,f64_bits);
  return;
}

Assistant:

void BinaryWriterSpec::WriteF64(uint64_t f64_bits, ExpectedNan expected) {
  switch (expected) {
    case ExpectedNan::None:
      json_stream_->Writef("\"%" PRIu64 "\"", f64_bits);
      break;

    case ExpectedNan::Arithmetic:
      WriteString("nan:arithmetic");
      break;

    case ExpectedNan::Canonical:
      WriteString("nan:canonical");
      break;
  }
}